

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unixmake2.cpp
# Opt level: O2

QString * escapeDir(QString *__return_storage_ptr__,QString *dir)

{
  char cVar1;
  long in_FS_OFFSET;
  QStringBuilder<const_QString_&,_char> local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  cVar1 = QString::endsWith((QChar)(char16_t)dir,0x5c);
  if (cVar1 == '\0') {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      QArrayDataPointer<char16_t>::QArrayDataPointer(&__return_storage_ptr__->d,&dir->d);
      return __return_storage_ptr__;
    }
  }
  else {
    local_28.b = '\\';
    local_28.a = dir;
    QStringBuilder<const_QString_&,_char>::convertTo<QString>(__return_storage_ptr__,&local_28);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
      return __return_storage_ptr__;
    }
  }
  __stack_chk_fail();
}

Assistant:

static QString escapeDir(const QString &dir)
{
    // When building on non-MSys MinGW, the path ends with a backslash, which
    // GNU make will interpret that as a line continuation. Doubling the backslash
    // avoids the problem, at the cost of the variable containing *both* backslashes.
    if (dir.endsWith('\\'))
        return dir + '\\';
    return dir;
}